

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::NestedDescriptorTest_MessageName_Test::
~NestedDescriptorTest_MessageName_Test(NestedDescriptorTest_MessageName_Test *this)

{
  NestedDescriptorTest_MessageName_Test *this_local;
  
  NestedDescriptorTest::~NestedDescriptorTest(&this->super_NestedDescriptorTest);
  return;
}

Assistant:

TEST_F(NestedDescriptorTest, MessageName) {
  EXPECT_EQ("Foo", foo_->name());
  EXPECT_EQ("Bar", bar_->name());
  EXPECT_EQ("Foo", foo2_->name());
  EXPECT_EQ("Baz", baz2_->name());

  EXPECT_EQ("TestMessage.Foo", foo_->full_name());
  EXPECT_EQ("TestMessage.Bar", bar_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.Foo", foo2_->full_name());
  EXPECT_EQ("corge.grault.TestMessage2.Baz", baz2_->full_name());
}